

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_pack_data
              (nghttp2_session *session,nghttp2_bufs *bufs,size_t datamax,nghttp2_frame *frame,
              nghttp2_data_aux_data *aux_data,nghttp2_stream *stream)

{
  nghttp2_buf_chain *pnVar1;
  size_t padlen;
  int iVar2;
  ssize_t sVar3;
  nghttp2_frame *pnVar4;
  nghttp2_frame *local_70;
  size_t max_payloadlen;
  nghttp2_buf *buf;
  ssize_t padded_payloadlen;
  ssize_t payloadlen;
  uint32_t data_flags;
  int rv;
  nghttp2_stream *stream_local;
  nghttp2_data_aux_data *aux_data_local;
  nghttp2_frame *frame_local;
  size_t datamax_local;
  nghttp2_bufs *bufs_local;
  nghttp2_session *session_local;
  
  _data_flags = stream;
  stream_local = (nghttp2_stream *)aux_data;
  aux_data_local = (nghttp2_data_aux_data *)frame;
  frame_local = (nghttp2_frame *)datamax;
  datamax_local = (size_t)bufs;
  bufs_local = (nghttp2_bufs *)session;
  if (bufs->head != bufs->cur) {
    __assert_fail("bufs->head == bufs->cur",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                  ,0x1e1b,
                  "int nghttp2_session_pack_data(nghttp2_session *, nghttp2_bufs *, size_t, nghttp2_frame *, nghttp2_data_aux_data *, nghttp2_stream *)"
                 );
  }
  pnVar1 = bufs->cur;
  max_payloadlen = (size_t)&pnVar1->buf;
  if ((session->callbacks).read_length_callback != (nghttp2_data_source_read_length_callback)0x0) {
    sVar3 = (*(session->callbacks).read_length_callback)
                      (session,(frame->hd).type,stream->stream_id,session->remote_window_size,
                       stream->remote_window_size,(session->remote_settings).max_frame_size,
                       session->user_data);
    padded_payloadlen =
         nghttp2_session_enforce_flow_control_limits
                   ((nghttp2_session *)bufs_local,_data_flags,sVar3);
    if (padded_payloadlen < 1) {
      return -0x386;
    }
    if ((ulong)((long)(pnVar1->buf).end - (long)(pnVar1->buf).last) < (ulong)padded_payloadlen) {
      payloadlen._4_4_ =
           nghttp2_bufs_realloc((nghttp2_bufs *)&bufs_local[10].mem,padded_payloadlen + 10);
      if (payloadlen._4_4_ == 0) {
        if (&bufs_local[10].mem != (nghttp2_mem **)datamax_local) {
          __assert_fail("&session->aob.framebufs == bufs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                        ,0x1e3f,
                        "int nghttp2_session_pack_data(nghttp2_session *, nghttp2_bufs *, size_t, nghttp2_frame *, nghttp2_data_aux_data *, nghttp2_stream *)"
                       );
        }
        max_payloadlen = *(long *)(datamax_local + 8) + 8;
      }
      else {
        padded_payloadlen = (ssize_t)frame_local;
      }
    }
    frame_local = (nghttp2_frame *)padded_payloadlen;
  }
  if (frame_local <=
      (nghttp2_frame *)(*(long *)(max_payloadlen + 8) - *(long *)(max_payloadlen + 0x18))) {
    payloadlen._0_4_ = 0;
    pnVar4 = (nghttp2_frame *)
             (*(code *)(stream_local->obq).q)
                       (bufs_local,*(undefined4 *)&(aux_data_local->data_prd).read_callback,
                        *(undefined8 *)(max_payloadlen + 0x10),frame_local,&payloadlen,stream_local,
                        bufs_local[0x28].cur);
    if (((pnVar4 == (nghttp2_frame *)0xfffffffffffffe04) ||
        (pnVar4 == (nghttp2_frame *)0xfffffffffffffdf7)) ||
       (pnVar4 == (nghttp2_frame *)0xfffffffffffffdf2)) {
      session_local._4_4_ = (int)pnVar4;
    }
    else if (((long)pnVar4 < 0) || (frame_local < pnVar4)) {
      session_local._4_4_ = -0x386;
    }
    else {
      *(long *)(max_payloadlen + 0x18) = *(long *)(max_payloadlen + 0x10) + (long)pnVar4;
      *(long *)(max_payloadlen + 0x10) = *(long *)(max_payloadlen + 0x10) + -9;
      *(undefined1 *)((long)&(aux_data_local->data_prd).read_callback + 5) = 0;
      if (((((uint)payloadlen & 1) != 0) &&
          (*(undefined1 *)((long)&(stream_local->obq).mem + 1) = 1,
          ((ulong)(stream_local->obq).mem & 1) != 0)) && (((uint)payloadlen & 2) == 0)) {
        *(byte *)((long)&(aux_data_local->data_prd).read_callback + 5) =
             *(byte *)((long)&(aux_data_local->data_prd).read_callback + 5) | 1;
      }
      if (((uint)payloadlen & 4) != 0) {
        if (bufs_local[0x26].chunk_keep == 0) {
          return -0x386;
        }
        *(undefined1 *)((long)&(stream_local->obq).mem + 2) = 1;
      }
      (aux_data_local->data_prd).source.ptr = pnVar4;
      aux_data_local->flags = '\0';
      aux_data_local->eof = '\0';
      aux_data_local->no_copy = '\0';
      *(undefined5 *)&aux_data_local->field_0x13 = 0;
      if (frame_local < (nghttp2_frame *)((long)(aux_data_local->data_prd).source.ptr + 0x100U)) {
        local_70 = frame_local;
      }
      else {
        local_70 = (nghttp2_frame *)((long)(aux_data_local->data_prd).source.ptr + 0x100);
      }
      sVar3 = session_call_select_padding
                        ((nghttp2_session *)bufs_local,(nghttp2_frame *)aux_data_local,
                         (size_t)local_70);
      iVar2 = nghttp2_is_fatal((int)sVar3);
      session_local._4_4_ = (int)sVar3;
      if (iVar2 == 0) {
        *(ssize_t *)&aux_data_local->flags = sVar3 - (long)pnVar4;
        nghttp2_frame_pack_frame_hd
                  (*(uint8_t **)(max_payloadlen + 0x10),(nghttp2_frame_hd *)aux_data_local);
        padlen._0_1_ = aux_data_local->flags;
        padlen._1_1_ = aux_data_local->eof;
        padlen._2_1_ = aux_data_local->no_copy;
        padlen._3_5_ = *(undefined5 *)&aux_data_local->field_0x13;
        payloadlen._4_4_ =
             nghttp2_frame_add_pad
                       ((nghttp2_bufs *)datamax_local,(nghttp2_frame_hd *)aux_data_local,padlen,
                        (uint)*(byte *)((long)&(stream_local->obq).mem + 2));
        session_local._4_4_ = payloadlen._4_4_;
        if (payloadlen._4_4_ == 0) {
          session_reschedule_stream((nghttp2_session *)bufs_local,_data_flags);
          if ((((aux_data_local->data_prd).source.ptr == (void *)0x0) &&
              (((uint)payloadlen & 1) != 0)) && (((uint)payloadlen & 2) != 0)) {
            session_local._4_4_ = -0x217;
          }
          else {
            session_local._4_4_ = 0;
          }
        }
      }
    }
    return session_local._4_4_;
  }
  __assert_fail("nghttp2_buf_avail(buf) >= datamax",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                ,0x1e48,
                "int nghttp2_session_pack_data(nghttp2_session *, nghttp2_bufs *, size_t, nghttp2_frame *, nghttp2_data_aux_data *, nghttp2_stream *)"
               );
}

Assistant:

int nghttp2_session_pack_data(nghttp2_session *session, nghttp2_bufs *bufs,
                              size_t datamax, nghttp2_frame *frame,
                              nghttp2_data_aux_data *aux_data,
                              nghttp2_stream *stream) {
  int rv;
  uint32_t data_flags;
  ssize_t payloadlen;
  ssize_t padded_payloadlen;
  nghttp2_buf *buf;
  size_t max_payloadlen;

  assert(bufs->head == bufs->cur);

  buf = &bufs->cur->buf;

  if (session->callbacks.read_length_callback) {

    payloadlen = session->callbacks.read_length_callback(
        session, frame->hd.type, stream->stream_id, session->remote_window_size,
        stream->remote_window_size, session->remote_settings.max_frame_size,
        session->user_data);

    DEBUGF("send: read_length_callback=%zd\n", payloadlen);

    payloadlen = nghttp2_session_enforce_flow_control_limits(session, stream,
                                                             payloadlen);

    DEBUGF("send: read_length_callback after flow control=%zd\n", payloadlen);

    if (payloadlen <= 0) {
      return NGHTTP2_ERR_CALLBACK_FAILURE;
    }

    if ((size_t)payloadlen > nghttp2_buf_avail(buf)) {
      /* Resize the current buffer(s).  The reason why we do +1 for
         buffer size is for possible padding field. */
      rv = nghttp2_bufs_realloc(&session->aob.framebufs,
                                (size_t)(NGHTTP2_FRAME_HDLEN + 1 + payloadlen));

      if (rv != 0) {
        DEBUGF("send: realloc buffer failed rv=%d", rv);
        /* If reallocation failed, old buffers are still in tact.  So
           use safe limit. */
        payloadlen = (ssize_t)datamax;

        DEBUGF("send: use safe limit payloadlen=%zd", payloadlen);
      } else {
        assert(&session->aob.framebufs == bufs);

        buf = &bufs->cur->buf;
      }
    }
    datamax = (size_t)payloadlen;
  }

  /* Current max DATA length is less then buffer chunk size */
  assert(nghttp2_buf_avail(buf) >= datamax);

  data_flags = NGHTTP2_DATA_FLAG_NONE;
  payloadlen = aux_data->data_prd.read_callback(
      session, frame->hd.stream_id, buf->pos, datamax, &data_flags,
      &aux_data->data_prd.source, session->user_data);

  if (payloadlen == NGHTTP2_ERR_DEFERRED ||
      payloadlen == NGHTTP2_ERR_TEMPORAL_CALLBACK_FAILURE ||
      payloadlen == NGHTTP2_ERR_PAUSE) {
    DEBUGF("send: DATA postponed due to %s\n",
           nghttp2_strerror((int)payloadlen));

    return (int)payloadlen;
  }

  if (payloadlen < 0 || datamax < (size_t)payloadlen) {
    /* This is the error code when callback is failed. */
    return NGHTTP2_ERR_CALLBACK_FAILURE;
  }

  buf->last = buf->pos + payloadlen;
  buf->pos -= NGHTTP2_FRAME_HDLEN;

  /* Clear flags, because this may contain previous flags of previous
     DATA */
  frame->hd.flags = NGHTTP2_FLAG_NONE;

  if (data_flags & NGHTTP2_DATA_FLAG_EOF) {
    aux_data->eof = 1;
    /* If NGHTTP2_DATA_FLAG_NO_END_STREAM is set, don't set
       NGHTTP2_FLAG_END_STREAM */
    if ((aux_data->flags & NGHTTP2_FLAG_END_STREAM) &&
        (data_flags & NGHTTP2_DATA_FLAG_NO_END_STREAM) == 0) {
      frame->hd.flags |= NGHTTP2_FLAG_END_STREAM;
    }
  }

  if (data_flags & NGHTTP2_DATA_FLAG_NO_COPY) {
    if (session->callbacks.send_data_callback == NULL) {
      DEBUGF("NGHTTP2_DATA_FLAG_NO_COPY requires send_data_callback set\n");

      return NGHTTP2_ERR_CALLBACK_FAILURE;
    }
    aux_data->no_copy = 1;
  }

  frame->hd.length = (size_t)payloadlen;
  frame->data.padlen = 0;

  max_payloadlen = nghttp2_min(datamax, frame->hd.length + NGHTTP2_MAX_PADLEN);

  padded_payloadlen =
      session_call_select_padding(session, frame, max_payloadlen);

  if (nghttp2_is_fatal((int)padded_payloadlen)) {
    return (int)padded_payloadlen;
  }

  frame->data.padlen = (size_t)(padded_payloadlen - payloadlen);

  nghttp2_frame_pack_frame_hd(buf->pos, &frame->hd);

  rv = nghttp2_frame_add_pad(bufs, &frame->hd, frame->data.padlen,
                             aux_data->no_copy);
  if (rv != 0) {
    return rv;
  }

  session_reschedule_stream(session, stream);

  if (frame->hd.length == 0 && (data_flags & NGHTTP2_DATA_FLAG_EOF) &&
      (data_flags & NGHTTP2_DATA_FLAG_NO_END_STREAM)) {
    /* DATA payload length is 0, and DATA frame does not bear
       END_STREAM.  In this case, there is no point to send 0 length
       DATA frame. */
    return NGHTTP2_ERR_CANCEL;
  }

  return 0;
}